

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall Mond::Lexer::GetToken(Lexer *this)

{
  bool bVar1;
  int end;
  int iVar2;
  DiagBuilder *pDVar3;
  Slice local_60;
  Pos local_58;
  Range local_50;
  Pos local_40;
  Slice local_38;
  Pos local_30;
  Range local_28;
  Lexer *local_18;
  Lexer *this_local;
  
  local_18 = this;
  bVar1 = IsEof(this->m_char);
  if (bVar1) {
    (this->m_token).type = TokEndOfFile;
    local_30 = this->m_pos;
    Range::Range(&local_28,local_30,0);
    (this->m_token).range.beg = local_28.beg;
    (this->m_token).range.end = local_28.end;
    iVar2 = (*this->m_source->_vptr_Source[4])();
    end = (*this->m_source->_vptr_Source[4])();
    Slice::Slice(&local_38,iVar2,end);
    (this->m_token).slice = local_38;
    this_local = (Lexer *)&this->m_token;
  }
  else if ((this->m_char == 0xd) || (this->m_char == 10)) {
    this_local = (Lexer *)MakeEndOfLine(this);
  }
  else {
    bVar1 = IsWhitespace(this->m_char);
    if (bVar1) {
      this_local = (Lexer *)MakeWhitespace(this);
    }
    else if ((this->m_char == 0x2f) && (this->m_peek == 0x2f)) {
      this_local = (Lexer *)MakeLineComment(this);
    }
    else if ((this->m_char == 0x2f) && (this->m_peek == 0x2a)) {
      this_local = (Lexer *)MakeBlockComment(this);
    }
    else {
      bVar1 = IsLetter(this->m_char);
      if ((bVar1) || (this->m_char == 0x5f)) {
        this_local = (Lexer *)MakeIdentifier(this);
      }
      else if ((this->m_char == 0x22) || (this->m_char == 0x27)) {
        this_local = (Lexer *)MakeStringLiteral(this);
      }
      else {
        bVar1 = IsDecDigit(this->m_char);
        if (bVar1) {
          this_local = (Lexer *)MakeNumberLiteral(this);
        }
        else {
          switch(this->m_char) {
          case 0x28:
            this_local = (Lexer *)MakePunctuation(this,TokLeftParen);
            break;
          case 0x29:
            this_local = (Lexer *)MakePunctuation(this,TokRightParen);
            break;
          default:
            bVar1 = OperatorLookup1(this->m_char,&(this->m_token).type);
            if (bVar1) {
              this_local = (Lexer *)MakeOperator(this);
            }
            else {
              local_40 = this->m_pos;
              pDVar3 = DiagBuilder::operator<<(this->m_diag,local_40);
              pDVar3 = DiagBuilder::operator<<(pDVar3,Error);
              pDVar3 = DiagBuilder::operator<<(pDVar3,LexUnexpectedCharacter);
              pDVar3 = DiagBuilder::operator<<(pDVar3,this->m_char);
              DiagBuilder::operator<<(pDVar3,DiagEnd);
              (this->m_token).type = TokUnknown;
              local_58 = this->m_pos;
              Range::Range(&local_50,local_58,1);
              (this->m_token).range.beg = local_50.beg;
              (this->m_token).range.end = local_50.end;
              iVar2 = (*this->m_source->_vptr_Source[4])();
              Slice::Slice(&local_60,iVar2);
              (this->m_token).slice = local_60;
              Advance(this);
              this_local = (Lexer *)&this->m_token;
            }
            break;
          case 0x2c:
            this_local = (Lexer *)MakePunctuation(this,TokComma);
            break;
          case 0x3a:
            this_local = (Lexer *)MakePunctuation(this,TokColon);
            break;
          case 0x3b:
            this_local = (Lexer *)MakePunctuation(this,TokSemicolon);
            break;
          case 0x5b:
            this_local = (Lexer *)MakePunctuation(this,TokLeftBracket);
            break;
          case 0x5d:
            this_local = (Lexer *)MakePunctuation(this,TokRightBracket);
            break;
          case 0x7b:
            this_local = (Lexer *)MakePunctuation(this,TokLeftBrace);
            break;
          case 0x7d:
            this_local = (Lexer *)MakePunctuation(this,TokRightBrace);
          }
        }
      }
    }
  }
  return (Token *)this_local;
}

Assistant:

Token &Lexer::GetToken()
{
	if (IsEof(m_char))
	{
		m_token.type = TokEndOfFile;
		m_token.range = Range(m_pos, 0);
		m_token.slice = Slice(m_source.Position(), m_source.Position());
		return m_token;
	}
	else if (m_char == '\r' || m_char == '\n')
	{
		return MakeEndOfLine();
	}
	else if (IsWhitespace(m_char))
	{
		return MakeWhitespace();
	}
	else if (m_char == '/' && m_peek == '/')
	{
		return MakeLineComment();
	}
	else if (m_char == '/' && m_peek == '*')
	{
		return MakeBlockComment();
	}
	else if (IsLetter(m_char) || m_char == '_')
	{
		return MakeIdentifier();
	}
	else if (m_char == '\"' || m_char == '\'')
	{
		return MakeStringLiteral();
	}
	else if (IsDecDigit(m_char))
	{
		return MakeNumberLiteral();
	}

	switch (m_char)
	{
	case ':': return MakePunctuation(TokColon);
	case ',': return MakePunctuation(TokComma);
	case ';': return MakePunctuation(TokSemicolon);
	case '(': return MakePunctuation(TokLeftParen);
	case ')': return MakePunctuation(TokRightParen);
	case '{': return MakePunctuation(TokLeftBrace);
	case '}': return MakePunctuation(TokRightBrace);
	case '[': return MakePunctuation(TokLeftBracket);
	case ']': return MakePunctuation(TokRightBracket);
	}

	// TODO: Handle !in and ... properly, and move them out of the operator table.
	// !in isn't handled at all currently.

	if (OperatorLookup1(m_char, m_token.type))
	{
		return MakeOperator();
	}

	m_diag
		<< m_pos
		<< Error
		<< LexUnexpectedCharacter
		<< m_char
		<< DiagEnd;

	m_token.type = TokUnknown;
	m_token.range = Range(m_pos, 1);
	m_token.slice = Slice(m_source.Position());
	Advance();
	return m_token;
}